

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitIteratorTopLevelFinally
               (ByteCodeLabel finallyLabel,RegSlot iteratorLocation,RegSlot shouldCallReturnLocation
               ,RegSlot yieldExceptionLocation,RegSlot yieldOffsetLocation,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,bool isAsync)

{
  ByteCodeWriter *this;
  Type TVar1;
  ParseableFunctionInfo *pPVar2;
  code *pcVar3;
  bool bVar4;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  
  pPVar2 = funcInfo->byteCodeFunction;
  pFVar6 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0080df17;
    *puVar5 = 0;
    pFVar6 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar6->functionBodyImpl).ptr != pPVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) {
LAB_0080df17:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pFVar6 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
  }
  TVar1 = pFVar6->attributes;
  this = &byteCodeGenerator->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::Empty(this,Leave);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,false);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,true);
  Js::ByteCodeWriter::Br(this,labelID);
  Js::ByteCodeWriter::MarkLabel(this,finallyLabel);
  Js::ByteCodeWriter::Empty(this,Finally);
  ByteCodeGenerator::PushJumpCleanupForTry
            (byteCodeGenerator,ResumeFinally,finallyLabel,yieldExceptionLocation,yieldOffsetLocation
            );
  labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::BrReg1(this,BrFalse_A,labelID_00,shouldCallReturnLocation);
  EmitIteratorClose(iteratorLocation,byteCodeGenerator,funcInfo,isAsync);
  Js::ByteCodeWriter::MarkLabel(this,labelID_00);
  DListBase<JumpCleanupInfo,_RealCount>::RemoveHead<Memory::ArenaAllocator>
            (&byteCodeGenerator->jumpCleanupList->super_DListBase<JumpCleanupInfo,_RealCount>,
             byteCodeGenerator->jumpCleanupList->allocator);
  if ((TVar1 & (Async|Generator)) != None) {
    FuncInfo::ReleaseTmpRegister(funcInfo,yieldOffsetLocation);
    FuncInfo::ReleaseTmpRegister(funcInfo,yieldExceptionLocation);
  }
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,false);
  Js::ByteCodeWriter::Empty(this,LeaveNull);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  return;
}

Assistant:

void EmitIteratorTopLevelFinally(
    Js::ByteCodeLabel finallyLabel,
    Js::RegSlot iteratorLocation,
    Js::RegSlot shouldCallReturnLocation,
    Js::RegSlot yieldExceptionLocation,
    Js::RegSlot yieldOffsetLocation,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    Js::ByteCodeLabel afterFinallyBlockLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);

    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(false);
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    byteCodeGenerator->Writer()->Br(afterFinallyBlockLabel);
    byteCodeGenerator->Writer()->MarkLabel(finallyLabel);
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Finally);

    byteCodeGenerator->PushJumpCleanupForTry(
        Js::OpCode::ResumeFinally,
        finallyLabel,
        yieldExceptionLocation,
        yieldOffsetLocation);

    Js::ByteCodeLabel skipCallCloseLabel = byteCodeGenerator->Writer()->DefineLabel();

    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, skipCallCloseLabel, shouldCallReturnLocation);
    EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo, isAsync);

    byteCodeGenerator->Writer()->MarkLabel(skipCallCloseLabel);

    byteCodeGenerator->PopJumpCleanup();
    if (isCoroutine)
    {
        funcInfo->ReleaseTmpRegister(yieldOffsetLocation);
        funcInfo->ReleaseTmpRegister(yieldExceptionLocation);
    }

    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(false);
    byteCodeGenerator->Writer()->Empty(Js::OpCode::LeaveNull);
    byteCodeGenerator->Writer()->MarkLabel(afterFinallyBlockLabel);
}